

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlBufferPtr xmlBufferCreateSize(size_t size)

{
  xmlBufferAllocationScheme *pxVar1;
  void *pvVar2;
  int local_28;
  xmlBufferPtr ret;
  size_t size_local;
  
  size_local = (size_t)(*xmlMalloc)(0x20);
  if ((long *)size_local == (long *)0x0) {
    xmlTreeErrMemory("creating buffer");
    size_local = 0;
  }
  else {
    *(undefined4 *)(size_local + 8) = 0;
    pxVar1 = __xmlBufferAllocScheme();
    *(xmlBufferAllocationScheme *)(size_local + 0x10) = *pxVar1;
    if (size == 0) {
      local_28 = 0;
    }
    else {
      local_28 = (int)size + 2;
    }
    *(int *)(size_local + 0xc) = local_28;
    if (*(int *)(size_local + 0xc) == 0) {
      *(long *)size_local = 0;
    }
    else {
      pvVar2 = (*xmlMallocAtomic)((size_t)*(undefined4 *)(size_local + 0xc));
      *(void **)size_local = pvVar2;
      if (*(long *)size_local == 0) {
        xmlTreeErrMemory("creating buffer");
        (*xmlFree)((void *)size_local);
        return (xmlBufferPtr)0x0;
      }
      **(undefined1 **)size_local = 0;
    }
    *(long *)(size_local + 0x18) = 0;
  }
  return (xmlBufferPtr)size_local;
}

Assistant:

xmlBufferPtr
xmlBufferCreateSize(size_t size) {
    xmlBufferPtr ret;

    ret = (xmlBufferPtr) xmlMalloc(sizeof(xmlBuffer));
    if (ret == NULL) {
	xmlTreeErrMemory("creating buffer");
        return(NULL);
    }
    ret->use = 0;
    ret->alloc = xmlBufferAllocScheme;
    ret->size = (size ? size+2 : 0);         /* +1 for ending null */
    if (ret->size){
        ret->content = (xmlChar *) xmlMallocAtomic(ret->size * sizeof(xmlChar));
        if (ret->content == NULL) {
	    xmlTreeErrMemory("creating buffer");
            xmlFree(ret);
            return(NULL);
        }
        ret->content[0] = 0;
    } else
	ret->content = NULL;
    ret->contentIO = NULL;
    return(ret);
}